

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall ast::Number::toString_abi_cxx11_(string *__return_storage_ptr__,Number *this)

{
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream msg;
  Number *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::to_string(&local_1b0,this->value);
  std::operator<<((ostream *)local_190,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::Number::toString() const {
    std::ostringstream msg;
    msg << std::to_string(value);
    return msg.str();
}